

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O3

uint zvgReadSpeedInfo(uint *speeds)

{
  uint uVar1;
  uint uVar2;
  uint readLen;
  uint local_1c;
  
  if ((((byte)ZvgIO.ecpFlags & 1) != 0) || (uVar1 = zvgSetEcpMode(), uVar1 == 0)) {
    zvgEcpPutc(0xee);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    uVar1 = zvgIsDataAvail(1000);
    if ((uVar1 == 0) && (uVar1 = zvgGetMem(ZvgIO.mBfr,4,&local_1c), uVar1 == 0)) {
      uVar1 = 0x14;
      if (local_1c == 4) {
        uVar1 = 0;
      }
      *speeds = (uint)ZvgIO.mBfr[0];
      speeds[1] = (uint)ZvgIO.mBfr[1];
      speeds[2] = (uint)ZvgIO.mBfr[2];
      speeds[3] = (uint)ZvgIO.mBfr[3];
      uVar2 = zvgSetEcpMode();
      if (uVar2 != 0) {
        uVar1 = uVar2;
      }
    }
  }
  return uVar1;
}

Assistant:

uint zvgReadSpeedInfo( ZvgSpeeds_a speeds)
{
	uint	readLen, ecpErr, err=0;

	if (!(ZvgIO.ecpFlags & ECPF_ECP))
		err = zvgSetEcpMode();				// if not ECP mode, set to ECP mode

	if (err)
		return (err);							// return on any errors

	// request speed table information

	// The ZVG has a 9 byte look ahead buffer.  Until at least 9 bytes are
	// in it's command buffer, nothing will get executed.  This requires
	// the zcREAD_SPD command to be followed by 8 NOPs in order to guarantee
	// execution.

	zvgEcpPutc( zcREAD_SPD);				// setup to read monitor information
	zvgEcpPutc( zcNOP);						// must fill enough of buffer to allow
	zvgEcpPutc( zcNOP);						// READ_MON to execute
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);
	zvgEcpPutc( zcNOP);

	// wait for command to execute

	err = zvgIsDataAvail( 1000);			// wait for a second for data to show up

	if (err)
		return (err);

	// read 4 speed table bytes into buffer

	err = zvgGetMem( ZvgIO.mBfr, 4, &readLen);

	if (err)
		return( err);

	if (!err && (readLen != 4))
		err = errEcpBadData;

	// move the buffered speeds to the speed array

	speeds[0] = (uint)ZvgIO.mBfr[0];
	speeds[1] = (uint)ZvgIO.mBfr[1];
	speeds[2] = (uint)ZvgIO.mBfr[2];
	speeds[3] = (uint)ZvgIO.mBfr[3];

	// return to ECP mode

	ecpErr = zvgSetEcpMode();

	if (ecpErr)
		err = ecpErr;							// an ECP error has higher priority than a bad data error

	return (err);
}